

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputVarName_abi_cxx11_(Node *this,Node *array,int InDefine)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  undefined1 local_148 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  undefined1 local_e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [64];
  VariableStruct *ThisVar;
  int flags;
  int InDefine_local;
  Node *array_local;
  Node *this_local;
  string *result;
  
  _flags = (Node *)CONCAT44(in_register_00000014,InDefine);
  ThisVar._0_4_ = (uint)((in_ECX & 1) != 0);
  local_68[0x37] = 0;
  ThisVar._4_4_ = in_ECX;
  array_local = array;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  local_68._56_8_ = VariableList::Lookup(Variables,&array->TextValue,_flags,0);
  if ((VariableStruct *)local_68._56_8_ == (VariableStruct *)0x0) {
    genname(local_88);
    std::__cxx11::string::operator=((string *)this,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_68,(int)local_68._56_8_);
    std::__cxx11::string::operator=((string *)this,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  if ((_flags != (Node *)0x0) && ((ThisVar._4_4_ & 2) == 0)) {
    if (((VariableStruct *)local_68._56_8_ == (VariableStruct *)0x0) ||
       (*(VARCLASS *)(local_68._56_8_ + 0x24) != VARCLASS_FUNC)) {
      for (; _flags != (Node *)0x0; _flags = _flags->Block[0]) {
        OutputArrayParam_abi_cxx11_((Node *)local_148,(int)_flags);
        std::operator+(local_148 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14bb52
                      );
        std::operator+(local_108,local_148 + 0x20);
        std::__cxx11::string::operator+=((string *)this,(string *)local_108);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string((string *)(local_148 + 0x20));
        std::__cxx11::string::~string((string *)local_148);
      }
    }
    else {
      NoParen_abi_cxx11_((Node *)local_e8);
      std::operator+(local_e8 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b59c);
      std::operator+(local_a8,local_e8 + 0x20);
      std::__cxx11::string::operator+=((string *)this,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)(local_e8 + 0x20));
      std::__cxx11::string::~string((string *)local_e8);
    }
  }
  return this;
}

Assistant:

std::string Node::OutputVarName(
	Node* array,		/**< Pointer to any array references */
	int InDefine		/**< Is this part of a definition,
       					bit 1 = Yes, bit2 = Don't add array dims*/
)
{
	int flags = 0;		// GetName flags

	if (InDefine & 1)
	{
		//
		// We don't want the prefix on the definition, since the
		// class name is already handled by the 'class' definition.
		//
		flags |= 1;
	}

	//
	// Local Variables
	//
	VariableStruct *ThisVar;
	std::string result;

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(TextValue, array);

	//
	// Make up a good name to print for this variable
	//
	if (ThisVar != 0)
	{
		result = ThisVar->GetName(flags);
	}
	else
	{
		result = genname(TextValue);
	}

	//
	// Handle array references (May need to be modified from x[a,b]
	// to x[a][b] manually.
	//
	if (array != 0 && (InDefine & 2) == 0)
	{
		if ((ThisVar != 0) && (ThisVar->Class == VARCLASS_FUNC))
		{
			result += "(" + array->NoParen() + ")";
		}
		else
		{
			while(array != 0)
			{
				result += "[" + array->OutputArrayParam(InDefine) + "]";
				array = array->Block[0];
			}
		}
	}

	return result;
}